

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O2

void av1_build_compound_diffwtd_mask_d16_c
               (uint8_t *mask,DIFFWTD_MASK_TYPE mask_type,CONV_BUF_TYPE *src0,int src0_stride,
               CONV_BUF_TYPE *src1,int src1_stride,int h,int w,ConvolveParams *conv_params,int bd)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  byte bVar5;
  undefined4 in_register_0000000c;
  ulong uVar6;
  int iVar7;
  undefined7 in_register_00000031;
  undefined4 in_register_0000008c;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  undefined4 in_stack_00000024;
  int in_stack_00000028;
  
  iVar7 = (int)CONCAT71(in_register_00000031,mask_type);
  if (iVar7 == 0) {
    bVar5 = ((char)bd - ((char)conv_params->round_0 + (char)conv_params->round_1)) + 6;
    uVar9 = 0;
    uVar10 = 0;
    if (0 < w) {
      uVar10 = (ulong)(uint)w;
    }
    uVar6 = (ulong)(uint)h;
    if (h < 1) {
      uVar6 = uVar9;
    }
    for (; uVar9 != uVar6; uVar9 = uVar9 + 1) {
      for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
        uVar3 = (uint)src0[uVar8] - (uint)src1[uVar8];
        uVar2 = -uVar3;
        if (0 < (int)uVar3) {
          uVar2 = uVar3;
        }
        uVar1 = (long)((int)((uVar2 & 0xffff) + ((1 << (bVar5 & 0x1f)) >> 1)) >> (bVar5 & 0x1f)) /
                0x10;
        uVar4 = uVar1 & 0xffffffff;
        if (0x19 < (int)uVar1) {
          uVar4 = 0x1a;
        }
        if ((int)uVar4 < -0x25) {
          uVar4 = 0xffffffda;
        }
        mask[uVar8] = (char)uVar4 + '&';
      }
      mask = mask + w;
      src1 = src1 + src1_stride;
      src0 = src0 + src0_stride;
    }
    return;
  }
  if (iVar7 == 1) {
    diffwtd_mask_d16(mask,1,(int)src0,(CONV_BUF_TYPE *)CONCAT44(in_register_0000000c,src0_stride),
                     (int)src1,(CONV_BUF_TYPE *)CONCAT44(in_register_0000008c,src1_stride),h,w,
                     (int)conv_params,(ConvolveParams *)CONCAT44(in_stack_00000024,bd),
                     in_stack_00000028);
    return;
  }
  return;
}

Assistant:

void av1_build_compound_diffwtd_mask_d16_c(
    uint8_t *mask, DIFFWTD_MASK_TYPE mask_type, const CONV_BUF_TYPE *src0,
    int src0_stride, const CONV_BUF_TYPE *src1, int src1_stride, int h, int w,
    ConvolveParams *conv_params, int bd) {
  switch (mask_type) {
    case DIFFWTD_38:
      diffwtd_mask_d16(mask, 0, 38, src0, src0_stride, src1, src1_stride, h, w,
                       conv_params, bd);
      break;
    case DIFFWTD_38_INV:
      diffwtd_mask_d16(mask, 1, 38, src0, src0_stride, src1, src1_stride, h, w,
                       conv_params, bd);
      break;
    default: assert(0);
  }
}